

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_2,_2> __thiscall
deqp::gles3::Functional::MatrixCaseUtils::increment<float,2,2>
          (MatrixCaseUtils *this,Matrix<float,_2,_2> *mat)

{
  int r;
  long lVar1;
  int c;
  long lVar2;
  Vector<float,_2> in_XMM1_Qa;
  Matrix<float,_2,_2> MVar3;
  
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      in_XMM1_Qa.m_data[0] = *(float *)((long)mat + lVar2 * 2 * 4) + 1.0;
      in_XMM1_Qa.m_data[1] = 0.0;
      *(float *)(this + lVar2 * 8) = in_XMM1_Qa.m_data[0];
    }
    mat = (Matrix<float,_2,_2> *)((long)mat + 4);
    this = this + 4;
  }
  MVar3.m_data.m_data[1].m_data[0] = in_XMM1_Qa.m_data[0];
  MVar3.m_data.m_data[1].m_data[1] = in_XMM1_Qa.m_data[1];
  MVar3.m_data.m_data[0].m_data[0] = 1.0;
  MVar3.m_data.m_data[0].m_data[1] = 0.0;
  return (Matrix<float,_2,_2>)MVar3.m_data.m_data;
}

Assistant:

tcu::Matrix<T, Rows, Cols> increment (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) + 1.0f;

	return retVal;
}